

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t parse_line(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mp,
                  wchar_t *parsed_kws)

{
  wchar_t wVar1;
  wchar_t local_44;
  wchar_t r1;
  wchar_t r;
  mtree_option *iter;
  wchar_t *parsed_kws_local;
  mtree_entry *mp_local;
  mtree *mtree_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  local_44 = L'\0';
  for (_r1 = mp->options; _r1 != (mtree_option *)0x0; _r1 = _r1->next) {
    wVar1 = parse_keyword(a,mtree,entry,_r1,parsed_kws);
    if (wVar1 < local_44) {
      local_44 = wVar1;
    }
  }
  if ((local_44 == L'\0') && ((*parsed_kws & 0x100U) == 0)) {
    archive_set_error(&a->archive,0x54,"Missing type keyword in mtree specification");
    a_local._4_4_ = L'\xffffffec';
  }
  else {
    a_local._4_4_ = local_44;
  }
  return a_local._4_4_;
}

Assistant:

static int
parse_line(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mp, int *parsed_kws)
{
	struct mtree_option *iter;
	int r = ARCHIVE_OK, r1;

	for (iter = mp->options; iter != NULL; iter = iter->next) {
		r1 = parse_keyword(a, mtree, entry, iter, parsed_kws);
		if (r1 < r)
			r = r1;
	}
	if (r == ARCHIVE_OK && (*parsed_kws & MTREE_HAS_TYPE) == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Missing type keyword in mtree specification");
		return (ARCHIVE_WARN);
	}
	return (r);
}